

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

void __thiscall GlobOptBlockData::DeleteBlockData(GlobOptBlockData *this)

{
  AllocatorType *allocator;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  JitArenaAllocator *alloc;
  GlobOptBlockData *this_local;
  
  allocator = this->globOpt->alloc;
  ValueHashTable<Sym_*,_Value_*>::Delete(this->symToValueMap);
  ValueHashTable<ExprHash,_Value_*>::Delete(this->exprToValueMap);
  Memory::
  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
            (allocator,this->liveFields);
  Memory::
  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
            (allocator,this->liveArrayValues);
  if (this->maybeWrittenTypeSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (allocator,this->maybeWrittenTypeSyms);
  }
  Memory::
  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
            (allocator,this->isTempSrc);
  Memory::
  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
            (allocator,this->liveVarSyms);
  Memory::
  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
            (allocator,this->liveInt32Syms);
  Memory::
  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
            (allocator,this->liveLossyInt32Syms);
  Memory::
  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
            (allocator,this->liveFloat64Syms);
  if (this->argObjSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (allocator,this->argObjSyms);
  }
  if (this->maybeTempObjectSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    if (this->canStoreTempObjectSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                         ,0xcf,"(!this->canStoreTempObjectSyms)","!this->canStoreTempObjectSyms");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  else {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (allocator,this->maybeTempObjectSyms);
    if (this->canStoreTempObjectSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      Memory::
      DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                (allocator,this->canStoreTempObjectSyms);
    }
  }
  Memory::
  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::BaseHashSet<Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Value*,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>>
            (allocator,this->valuesToKillOnCalls);
  if (this->inductionVariables != (InductionVariableSet *)0x0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::BaseHashSet<InductionVariable,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,unsigned_int,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>>
              (allocator,this->inductionVariables);
  }
  if (this->availableIntBoundChecks != (IntBoundCheckSet *)0x0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::BaseHashSet<IntBoundCheck,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,IntBoundCheckCompatibilityId,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>>
              (allocator,this->availableIntBoundChecks);
  }
  if (this->stackLiteralInitFldDataMap != (StackLiteralInitFldDataMap *)0x0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>>
              (allocator,this->stackLiteralInitFldDataMap);
  }
  Memory::
  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
            (allocator,this->changedSyms);
  this->changedSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  if ((this->capturedValues != (CapturedValues *)0x0) &&
     (uVar3 = CapturedValues::DecrementRefCount(this->capturedValues), uVar3 == 0)) {
    Memory::DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,CapturedValues>
              (this->curFunc->m_alloc,this->capturedValues);
    this->capturedValues = (CapturedValues *)0x0;
  }
  OnDataDeleted(this);
  return;
}

Assistant:

void
GlobOptBlockData::DeleteBlockData()
{
    JitArenaAllocator *const alloc = this->globOpt->alloc;

    this->symToValueMap->Delete();
    this->exprToValueMap->Delete();

    JitAdelete(alloc, this->liveFields);
    JitAdelete(alloc, this->liveArrayValues);
    if (this->maybeWrittenTypeSyms)
    {
        JitAdelete(alloc, this->maybeWrittenTypeSyms);
    }
    JitAdelete(alloc, this->isTempSrc);
    JitAdelete(alloc, this->liveVarSyms);
    JitAdelete(alloc, this->liveInt32Syms);
    JitAdelete(alloc, this->liveLossyInt32Syms);
    JitAdelete(alloc, this->liveFloat64Syms);
    if (this->argObjSyms)
    {
        JitAdelete(alloc, this->argObjSyms);
    }
    if (this->maybeTempObjectSyms)
    {
        JitAdelete(alloc, this->maybeTempObjectSyms);
        if (this->canStoreTempObjectSyms)
        {
            JitAdelete(alloc, this->canStoreTempObjectSyms);
        }
    }
    else
    {
        Assert(!this->canStoreTempObjectSyms);
    }

    JitAdelete(alloc, this->valuesToKillOnCalls);

    if(this->inductionVariables)
    {
        JitAdelete(alloc, this->inductionVariables);
    }
    if(this->availableIntBoundChecks)
    {
        JitAdelete(alloc, this->availableIntBoundChecks);
    }

    if (this->stackLiteralInitFldDataMap)
    {
        JitAdelete(alloc, this->stackLiteralInitFldDataMap);
    }

    JitAdelete(alloc, this->changedSyms);
    this->changedSyms = nullptr;

    if (this->capturedValues && this->capturedValues->DecrementRefCount() == 0)
    {
        JitAdelete(this->curFunc->m_alloc, this->capturedValues);
        this->capturedValues = nullptr;
    }
    this->OnDataDeleted();
}